

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixOR<double>::MultiThread_Assemble
          (TPZStructMatrixOR<double> *this,TPZBaseMatrix *mat,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZGuiInterface *this_00;
  bool bVar1;
  uint uVar2;
  TPZStructMatrix *strmat;
  uint uVar3;
  long lVar4;
  TPZAutoPointer<TPZGuiInterface> local_180;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  ThreadData *local_158;
  thread local_150;
  ThreadData threaddata;
  
  strmat = (TPZStructMatrix *)
           __dynamic_cast(this,&typeinfo,&::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  if (strmat == (TPZStructMatrix *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZStructMatrixOR<double>::MultiThread_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr,"Run-time error.Aborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixor.cpp"
               ,0x1e3);
  }
  local_180 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_180.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_180.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  ThreadData::ThreadData
            (&threaddata,strmat,mat,rhs,&strmat->fMaterialIds,&local_180,
             (bool)(&this->field_0xc)[*(long *)(*(long *)this + -0x60)]);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_180);
  uVar3 = *(uint *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60));
  allthreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allthreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allthreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((guiInterface->fRef != (TPZReference *)0x0) &&
     (this_00 = guiInterface->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) {
    bVar1 = TPZGuiInterface::AmIKilled(this_00);
    if (bVar1) goto LAB_011a29ce;
  }
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar3 = uVar2;
  while (bVar1 = uVar3 != 0, uVar3 = uVar3 - 1, bVar1) {
    local_158 = &threaddata;
    std::thread::thread<void*(&)(void*),TPZStructMatrixOR<double>::ThreadData*,void>
              (&local_150,ThreadData::ThreadWork,&local_158);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&allthreads,&local_150);
    std::thread::~thread(&local_150);
  }
  ThreadData::ThreadAssembly(&threaddata);
  for (lVar4 = 0; (ulong)uVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    std::thread::join();
  }
LAB_011a29ce:
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&allthreads);
  ThreadData::~ThreadData(&threaddata);
  return;
}

Assistant:

void
TPZStructMatrixOR<TVar>::MultiThread_Assemble(TPZBaseMatrix & mat, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    if(!myself){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"Run-time error.Aborting...\n";
        DebugStop();
    }
    ThreadData threaddata(myself,mat,rhs,myself->MaterialIds(),guiInterface,ComputeRhs());
    const int numthreads = this->fNumThreads;
    std::vector<std::thread> allthreads;
    int itr;
    if (guiInterface) {
        if (guiInterface->AmIKilled()) {
            return;
        }
    }
    for (itr = 0; itr < numthreads; itr++) {
      allthreads.push_back(std::thread(ThreadData::ThreadWork, &threaddata));
    }

    ThreadData::ThreadAssembly(&threaddata);

    for (itr = 0; itr < numthreads; itr++) {
      allthreads[itr].join();
    }

#ifdef PZ_LOG2
    if (loggerCheck.isDebugEnabled()) {
        std::stringstream sout;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        mat.Print("Matriz de Rigidez: ", sout, EMathematicaInput);
        rhs.Print("Right Handside", sout, EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck, sout.str())
    }
#endif
}